

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

void __thiscall BasePort::SetDefaultProtocol(BasePort *this)

{
  ostream *poVar1;
  char *pcVar2;
  
  this->Protocol_ = PROTOCOL_SEQ_RW;
  if ((this->NumOfNodes_ == 0) || (this->IsAllBoardsBroadcastCapable_ != true)) {
    return;
  }
  if ((this->IsAllBoardsRev4_6_ == false) &&
     ((this->IsAllBoardsRev7_ == false && (this->IsAllBoardsRev8_9_ != true)))) {
    pcVar2 = 
    "BasePort::SetDefaultProtocol: all nodes broadcast capable, but disabled due to mix of firmware"
    ;
  }
  else {
    this->Protocol_ = PROTOCOL_SEQ_R_BC_W;
    pcVar2 = "BasePort::SetDefaultProtocol: all nodes broadcast capable and support shorter wait";
    if ((this->IsAllBoardsRev6_ == false) &&
       ((this->IsAllBoardsRev7_ == false && (this->IsAllBoardsRev8_9_ == false)))) {
      pcVar2 = 
      "BasePort::SetDefaultProtocol: all nodes broadcast capable and some support shorter wait";
      if (this->IsAllBoardsRev4_5_ != false) {
        pcVar2 = 
        "BasePort::SetDefaultProtocol: all nodes broadcast capable and do not support shorter wait";
      }
      if ((this->IsAllBoardsRev4_6_ | this->IsAllBoardsRev4_5_) != 1) {
        return;
      }
    }
  }
  poVar1 = std::operator<<(this->outStr,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void BasePort::SetDefaultProtocol(void)
{
    Protocol_ = BasePort::PROTOCOL_SEQ_RW;
    // Use broadcast by default if all firmware are bc capable
    if ((NumOfNodes_ > 0) && IsAllBoardsBroadcastCapable_) {
        if (IsBroadcastFirmwareMixValid()) {
            Protocol_ = BasePort::PROTOCOL_SEQ_R_BC_W;
            if (IsBroadcastShorterWait())
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and support shorter wait" << std::endl;
            else if (IsAllBoardsRev4_5_)
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and do not support shorter wait" << std::endl;
            else if (IsAllBoardsRev4_6_)
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and some support shorter wait" << std::endl;
        }
        else
            outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable, but disabled due to mix of firmware" << std::endl;
    }
}